

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O0

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>_>::TPZCompElWithMem
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>_> *this,TPZCompMesh *mesh,
          TPZGeoEl *gel)

{
  TPZRegisterClassId *in_RDI;
  H1Family unaff_retaddr;
  TPZGeoEl *in_stack_00000008;
  TPZCompMesh *in_stack_00000010;
  void **in_stack_00000018;
  TPZCompElH1<pzshape::TPZShapeQuad> *in_stack_00000020;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapeQuad>>>
            (in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024eea90);
  TPZCompElH1<pzshape::TPZShapeQuad>::TPZCompElH1
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  *(undefined ***)in_RDI = &PTR__TPZCompElWithMem_024ee668;
  *(undefined ***)in_RDI = &PTR__TPZCompElWithMem_024ee668;
  TPZStack<long,_128>::TPZStack((TPZStack<long,_128> *)in_RDI);
  (**(code **)(*(long *)in_RDI + 0x168))();
  return;
}

Assistant:

TPZCompElWithMem<TBASE>::TPZCompElWithMem(TPZCompMesh &mesh, TPZGeoEl *gel) :
TPZRegisterClassId(&TPZCompElWithMem::ClassId),
TBASE(mesh, gel){
    PrepareIntPtIndices();
}